

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unixSectorSize(sqlite3_file *id)

{
  byte *pbVar1;
  
  if (*(int *)&id[0xe].pMethods == 0) {
    if (((ulong)id[3].pMethods & 0x10000000000000) != 0) {
      pbVar1 = (byte *)((long)&id[0xe].pMethods + 5);
      *pbVar1 = *pbVar1 | 0x10;
    }
    pbVar1 = (byte *)((long)&id[0xe].pMethods + 5);
    *pbVar1 = *pbVar1 | 0x80;
    *(undefined4 *)&id[0xe].pMethods = 0x1000;
  }
  return *(int *)&id[0xe].pMethods;
}

Assistant:

static void setDeviceCharacteristics(unixFile *pFd){
  assert( pFd->deviceCharacteristics==0 || pFd->sectorSize!=0 );
  if( pFd->sectorSize==0 ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    int res;
    u32 f = 0;

    /* Check for support for F2FS atomic batch writes. */
    res = osIoctl(pFd->h, F2FS_IOC_GET_FEATURES, &f);
    if( res==0 && (f & F2FS_FEATURE_ATOMIC_WRITE) ){
      pFd->deviceCharacteristics = SQLITE_IOCAP_BATCH_ATOMIC;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    /* Set the POWERSAFE_OVERWRITE flag if requested. */
    if( pFd->ctrlFlags & UNIXFILE_PSOW ){
      pFd->deviceCharacteristics |= SQLITE_IOCAP_POWERSAFE_OVERWRITE;
    }
    pFd->deviceCharacteristics |= SQLITE_IOCAP_SUBPAGE_READ;

    pFd->sectorSize = SQLITE_DEFAULT_SECTOR_SIZE;
  }
}